

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int VmJsonArrayEncode(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  int iVar1;
  json_private_data *pJson;
  
  iVar1 = *(int *)((long)pUserData + 0x10);
  if (iVar1 < 0x20) {
    if (*(int *)((long)pUserData + 8) == 0) {
      SyBlobAppend(*pUserData,",",1);
      iVar1 = *(int *)((long)pUserData + 0x10);
    }
    *(int *)((long)pUserData + 0x10) = iVar1 + 1;
    VmJsonEncode(pValue,(json_private_data *)pUserData);
    *(int *)((long)pUserData + 0x10) = *(int *)((long)pUserData + 0x10) + -1;
    *(undefined4 *)((long)pUserData + 8) = 0;
  }
  return 0;
}

Assistant:

static int VmJsonArrayEncode(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	json_private_data *pJson = (json_private_data *)pUserData;
	if( pJson->nRecCount > 31 ){
		/* Recursion limit reached, return immediately */
		SXUNUSED(pKey); /* cc warning */
		return JX9_OK;
	}
	if( !pJson->isFirst ){
		/* Append the colon first */
		SyBlobAppend(pJson->pOut,",",(int)sizeof(char));
	}
	/* Encode the value */
	pJson->nRecCount++;
	VmJsonEncode(pValue, pJson);
	pJson->nRecCount--;
	pJson->isFirst = 0;
	return JX9_OK;
}